

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidSplitNdWrongNumSplits(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *pNVar7;
  NeuralNetworkLayer *this;
  Tensor *pTVar8;
  SplitNDLayerParams *pSVar9;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  undefined8 *puVar13;
  int iVar14;
  char *pcVar15;
  Result res1;
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"output",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pNVar7 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output1");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output2");
  pTVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar8->rank_ = 3;
  pSVar9 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_splitnd(this);
  pSVar9->numsplits_ = 5;
  CoreML::validate<(MLModelType)500>(&res1,&m);
  bVar2 = CoreML::Result::good(&res1);
  if (bVar2) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x152c);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar15 = "!((res1).good())";
  }
  else {
    psVar11 = CoreML::Result::message_abi_cxx11_(&res1);
    iVar14 = 0;
    lVar12 = std::__cxx11::string::find((char *)psVar11,0x2e2ed4);
    if (lVar12 != -1) goto LAB_0015a293;
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x152d);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar15 = "res1.message().find(\"match\") != std::string::npos";
  }
  poVar10 = std::operator<<(poVar10,pcVar15);
  poVar10 = std::operator<<(poVar10," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar14 = 1;
LAB_0015a293:
  std::__cxx11::string::~string((string *)&res1.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar14;
}

Assistant:

int testInvalidSplitNdWrongNumSplits() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output1");
    layers->add_output("output2");
    layers->add_inputtensor()->set_rank(3);

    // missing required parameters
    auto *params = layers->mutable_splitnd();
    params->set_numsplits(5);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("match") != std::string::npos);

    return 0;

}